

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

ByteData * __thiscall
cfd::ConfidentialTransactionContext::CreateSignatureHash
          (ByteData *__return_storage_ptr__,ConfidentialTransactionContext *this,OutPoint *outpoint,
          Script *redeem_script,SigHashType *sighash_type,ConfidentialValue *value,
          WitnessVersion version)

{
  uint32_t txin_index;
  ByteData256 sighash;
  ByteData local_70;
  ByteData256 local_58;
  SigHashType local_3c;
  
  txin_index = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
                 _vptr_AbstractTransaction[0xf])(this,outpoint);
  core::Script::GetData(&local_70,redeem_script);
  core::SigHashType::SigHashType(&local_3c,sighash_type);
  core::ConfidentialTransaction::GetElementsSignatureHash
            (&local_58,&this->super_ConfidentialTransaction,txin_index,&local_70,&local_3c,value,
             version);
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  core::ByteData256::GetBytes(&local_70.data_,&local_58);
  core::ByteData::ByteData(__return_storage_ptr__,&local_70.data_);
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransactionContext::CreateSignatureHash(
    const OutPoint& outpoint, const Script& redeem_script,
    SigHashType sighash_type, const ConfidentialValue& value,
    WitnessVersion version) const {
  // TODO(k-matsuzawa): For now, when using OP_CODESEPARATOR, divide it on the user side and ask them to specify only the applicable part.  // NOLINT
  ByteData256 sighash = GetElementsSignatureHash(
      GetTxInIndex(outpoint), redeem_script.GetData(), sighash_type, value,
      version);
  return ByteData(sighash.GetBytes());
}